

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_constraint.cpp
# Opt level: O0

void __thiscall Animation_Constraint::Update(Animation_Constraint *this)

{
  bool bVar1;
  Am_Value *pAVar2;
  byte local_8b;
  bool local_89;
  Am_Object local_78;
  undefined1 local_70 [8];
  Am_Value t;
  Am_Value s;
  Am_Value_List targets;
  Am_Value_List starts;
  bool initialized;
  bool different;
  Am_Object local_20;
  undefined1 local_11;
  Animation_Constraint *pAStack_10;
  bool running;
  Animation_Constraint *this_local;
  
  if ((this->change_enqueued & 1U) != 0) {
    this->change_enqueued = false;
    pAStack_10 = this;
    pAVar2 = Am_Object::Get(&(this->interpolator).super_Am_Object,0xf7,0);
    local_11 = Am_Value::operator_cast_to_bool(pAVar2);
    if ((bool)local_11) {
      if ((this->must_abort_animation & 1U) == 0) {
        Am_Interrupt_Animator(&(this->interpolator).super_Am_Object,&this->target);
        return;
      }
      this->must_abort_animation = false;
      Am_Object::Am_Object(&local_20,&(this->interpolator).super_Am_Object);
      Am_Abort_Animator(&local_20);
      Am_Object::~Am_Object(&local_20);
    }
    if ((this->multi_slot & 1U) == 0) {
      starts.item._3_1_ = Am_Value::operator!=(&this->start,&this->target);
      bVar1 = Am_Value::Exists(&this->start);
      local_89 = false;
      if (bVar1) {
        local_89 = Am_Value::Exists(&this->target);
      }
      starts.item._2_1_ = local_89;
    }
    else {
      Am_Value_List::Am_Value_List((Am_Value_List *)&targets.item,&this->start);
      Am_Value_List::Am_Value_List((Am_Value_List *)&s.value,&this->target);
      starts.item._3_1_ = false;
      starts.item._2_1_ = true;
      Am_Value_List::Start((Am_Value_List *)&targets.item);
      Am_Value_List::Start((Am_Value_List *)&s.value);
      while( true ) {
        bVar1 = Am_Value_List::Last((Am_Value_List *)&targets.item);
        local_8b = 0;
        if (!bVar1) {
          bVar1 = Am_Value_List::Last((Am_Value_List *)&s.value);
          local_8b = bVar1 ^ 0xff;
        }
        if ((local_8b & 1) == 0) break;
        pAVar2 = Am_Value_List::Get((Am_Value_List *)&targets.item);
        Am_Value::Am_Value((Am_Value *)&t.value,pAVar2);
        pAVar2 = Am_Value_List::Get((Am_Value_List *)&s.value);
        Am_Value::Am_Value((Am_Value *)local_70,pAVar2);
        bVar1 = Am_Value::Exists((Am_Value *)&t.value);
        if ((!bVar1) || (bVar1 = Am_Value::Exists((Am_Value *)local_70), !bVar1)) {
          starts.item._2_1_ = false;
        }
        bVar1 = Am_Value::operator!=((Am_Value *)&t.value,(Am_Value *)local_70);
        if (bVar1) {
          starts.item._3_1_ = true;
        }
        Am_Value::~Am_Value((Am_Value *)local_70);
        Am_Value::~Am_Value((Am_Value *)&t.value);
        Am_Value_List::Next((Am_Value_List *)&targets.item);
        Am_Value_List::Next((Am_Value_List *)&s.value);
      }
      Am_Value_List::~Am_Value_List((Am_Value_List *)&s.value);
      Am_Value_List::~Am_Value_List((Am_Value_List *)&targets.item);
    }
    if ((starts.item._3_1_ != false) && (starts.item._2_1_ != false)) {
      Am_Object::Am_Object(&local_78,&(this->interpolator).super_Am_Object);
      Am_Start_Animator(&local_78,&this->start,&this->target);
      Am_Object::~Am_Object(&local_78);
    }
  }
  return;
}

Assistant:

void
Animation_Constraint::Update()
{
  // std::cout << "Animation_Constraint::Update" <<std::endl;

  if (change_enqueued) {
    change_enqueued = false;

    bool running = interpolator.Get(Am_RUNNING);

    if (running) {
      if (must_abort_animation) {
        must_abort_animation = false;
        Am_Abort_Animator(interpolator);
      } else {
        Am_Interrupt_Animator(interpolator, target);
        return;
      }
    }

    // Decide whether to start the animation.
    // Do so only if at least one slot's target is different from its start,
    // and all slots have initialized starts and targets
    bool different;
    bool initialized;
    if (!multi_slot) {
      different = (start != target);
      initialized = start.Exists() && target.Exists();
    } else {
      Am_Value_List starts = start;
      Am_Value_List targets = target;

      different = false;
      initialized = true;

      for (starts.Start(), targets.Start(); !starts.Last() && !targets.Last();
           starts.Next(), targets.Next()) {
        Am_Value s = starts.Get();
        Am_Value t = targets.Get();

        if (!s.Exists() || !t.Exists())
          initialized = false;

        if (s != t)
          different = true;
      }
    }

    if (different && initialized)
      Am_Start_Animator(interpolator, start, target);
  }
}